

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O3

int read_word(char *str,char *word,int word_size)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  byte bVar6;
  
  for (uVar3 = 0; (bVar6 = str[uVar3], bVar6 - 9 < 2 || (bVar6 == 0x20)); uVar3 = uVar3 + 1) {
  }
  if (bVar6 == 0) {
    iVar1 = (int)uVar3;
  }
  else {
    uVar2 = uVar3 & 0xffffffff;
    lVar5 = 0;
    while( true ) {
      iVar1 = (int)uVar2;
      iVar4 = (int)lVar5;
      if ((bVar6 < 0x21) && ((0x100000601U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) {
        if (word == (char *)0x0) {
          return iVar1;
        }
        word = word + (int)(iVar4 - (uint)(word_size <= iVar4));
        goto LAB_001037a7;
      }
      if (word_size <= lVar5 && word != (char *)0x0) break;
      if (word != (char *)0x0) {
        word[lVar5] = bVar6;
      }
      uVar2 = (ulong)(iVar1 + 1);
      bVar6 = str[uVar3 + 1 + lVar5];
      lVar5 = lVar5 + 1;
    }
    if (word_size < 1) {
      return iVar4;
    }
    word = word + ((ulong)(uint)word_size - 1);
    iVar1 = iVar4;
  }
LAB_001037a7:
  *word = '\0';
  return iVar1;
}

Assistant:

static int read_word(char *str, char *word, int word_size) 
{
   int word_cur = 0;
   int len = 0;
   while (*str == ' ' || *str == '\t' || *str == '\n') {
      str++;
      len++;
   }
   if (*str == '\0') {
      *word = '\0';
      return len;
   }
   while (*str != ' ' && *str != '\t' && *str != '\n' && *str != '\0') {
      if (word && word_cur >= word_size) {
         if (word_size > 0 && word)
            word[word_size-1] = '\0';
         return word_cur;
      }
      if (word)
         word[word_cur] = *str;
      word_cur++;
      str++;
      len++;
   }
   if (word_cur >= word_size)
      word_cur--;
   if (word)
      word[word_cur] = '\0';
   return len;
}